

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O1

void __thiscall
ParsedPGTrackData::extractData(ParsedPGTrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  int iVar1;
  undefined1 auVar2 [16];
  uint16_t uVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  int iVar6;
  ulong __n;
  uint8_t *puVar7;
  
  puVar5 = buff + (long)size + -3;
  puVar7 = buff;
  iVar1 = -1;
  do {
    iVar6 = iVar1;
    if (puVar5 < puVar7) break;
    uVar3 = AV_RB16(puVar7 + 1);
    puVar7 = puVar7 + (ushort)(uVar3 + 3);
    iVar1 = iVar6 + 1;
  } while ((uint16_t)(uVar3 + 3) != 0);
  if (puVar7 == buff + size) {
    iVar1 = size + (iVar6 + 1) * 10;
    pkt->size = iVar1;
    puVar7 = (uint8_t *)operator_new__((long)iVar1);
    pkt->data = puVar7;
    if (buff <= puVar5) {
      do {
        uVar3 = AV_RB16(buff + 1);
        puVar7[0] = 'P';
        puVar7[1] = 'G';
        auVar2 = SEXT816(0x4754ea55f5d46497) * SEXT816(pkt->pts);
        uVar4 = my_ntohl((int)(auVar2._8_8_ >> 0xe) - (auVar2._12_4_ >> 0x1f));
        *(uint32_t *)(puVar7 + 2) = uVar4;
        puVar7[6] = '\0';
        puVar7[7] = '\0';
        puVar7[8] = '\0';
        puVar7[9] = '\0';
        __n = (ulong)(ushort)(uVar3 + 3);
        memcpy(puVar7 + 10,buff,__n);
        buff = buff + __n;
        puVar7 = puVar7 + __n + 10;
      } while (buff <= puVar5);
    }
    if (puVar7 != pkt->data + pkt->size) {
      __assert_fail("dst == pkt->data + pkt->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/matroskaParser.cpp"
                    ,0x1b1,
                    "virtual void ParsedPGTrackData::extractData(AVPacket *, uint8_t *, const int)")
      ;
    }
  }
  else {
    pkt->size = 0;
    pkt->data = (uint8_t *)0x0;
  }
  return;
}

Assistant:

void ParsedPGTrackData::extractData(AVPacket* pkt, uint8_t* buff, const int size)
{
    static constexpr int PG_HEADER_SIZE = 10;

    const uint8_t* curPtr = buff;
    const uint8_t* end = buff + size;
    int blocks = 0;
    while (curPtr <= end - 3)
    {
        const uint16_t blockSize = AV_RB16(curPtr + 1) + 3;
        if (blockSize == 0)
            break;
        curPtr += blockSize;
        blocks++;
    }
    // assert(curPtr == end);
    if (curPtr != end)
    {
        pkt->size = 0;
        pkt->data = nullptr;
        return;  // ignore invalid packet
    }

    pkt->size = size + PG_HEADER_SIZE * blocks;
    pkt->data = new uint8_t[pkt->size];
    curPtr = buff;
    uint8_t* dst = pkt->data;
    while (curPtr <= end - 3)
    {
        const uint16_t blockSize = AV_RB16(curPtr + 1) + 3;

        dst[0] = 'P';
        dst[1] = 'G';
        const auto ptsDts = reinterpret_cast<uint32_t*>(dst + 2);
        ptsDts[0] = my_htonl(static_cast<uint32_t>(internalClockToPts(pkt->pts)));
        ptsDts[1] = 0;
        dst += PG_HEADER_SIZE;
        memcpy(dst, curPtr, blockSize);
        curPtr += blockSize;
        dst += blockSize;
    }
    assert(dst == pkt->data + pkt->size);
}